

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O2

_Bool do_vfp_3op_dp(DisasContext_conflict1 *s,VFPGen3OpDPFn_conflict *fn,int vd,int vn,int vm,
                   _Bool reads_vd)

{
  TCGContext_conflict1 *tcg_ctx;
  uint uVar1;
  _Bool _Var2;
  uint uVar3;
  TCGv_i64 var;
  TCGv_i64 var_00;
  TCGv_i64 var_01;
  TCGv_ptr pTVar4;
  int iVar5;
  
  uVar3 = s->isar->mvfr0;
  if ((uVar3 & 0xf00) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    iVar5 = s->vec_len;
    if ((((uVar3 & 0xe) != 0) || (((vn | vd | vm) & 0x10U) == 0)) &&
       (((uVar3 & 0xf000000) != 0 || ((iVar5 == 0 && (s->vec_stride == 0)))))) {
      _Var2 = vfp_access_check(s);
      if (!_Var2) {
        return true;
      }
      if (iVar5 < 1) {
        uVar3 = 0;
        uVar1 = 0;
      }
      else if ((vd & 0xcU) == 0) {
        uVar3 = 0;
        iVar5 = 0;
        uVar1 = 0;
      }
      else {
        uVar3 = (s->vec_stride >> 1) + 1;
        uVar1 = vm & 0xcU;
        if ((vm & 0xcU) != 0) {
          uVar1 = uVar3;
        }
      }
      var = tcg_temp_new_i64(tcg_ctx);
      var_00 = tcg_temp_new_i64(tcg_ctx);
      var_01 = tcg_temp_new_i64(tcg_ctx);
      pTVar4 = get_fpstatus_ptr_aarch64(tcg_ctx,0);
      neon_load_reg64(tcg_ctx,var,vn);
      neon_load_reg64(tcg_ctx,var_00,vm);
      do {
        iVar5 = -iVar5;
        do {
          if (reads_vd) {
            neon_load_reg64(tcg_ctx,var_01,vd);
          }
          (*fn)(tcg_ctx,var_01,var,var_00,pTVar4);
          neon_store_reg64(tcg_ctx,var_01,vd);
          iVar5 = iVar5 + 1;
          if (iVar5 == 1) {
            tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
            tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var_00 + (long)tcg_ctx));
            tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var_01 + (long)tcg_ctx));
            tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
            return true;
          }
          vd = vd & 0xfffffffcU | uVar3 + vd & 3;
          vn = vn & 0xfffffffcU | vn + uVar3 & 3;
          neon_load_reg64(tcg_ctx,var,vn);
        } while (uVar1 == 0);
        vm = vm & 0xfffffffcU | uVar1 + vm & 3;
        neon_load_reg64(tcg_ctx,var_00,vm);
        iVar5 = -iVar5;
      } while( true );
    }
  }
  return false;
}

Assistant:

static bool do_vfp_3op_dp(DisasContext *s, VFPGen3OpDPFn *fn,
                          int vd, int vn, int vm, bool reads_vd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_m = 0;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i64 f0, f1, fd;
    TCGv_ptr fpst;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && ((vd | vn | vm) & 0x10)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_dreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = (s->vec_stride >> 1) + 1;

            if (vfp_dreg_is_scalar(vm)) {
                /* mixed scalar/vector */
                delta_m = 0;
            } else {
                /* vector */
                delta_m = delta_d;
            }
        }
    }

    f0 = tcg_temp_new_i64(tcg_ctx);
    f1 = tcg_temp_new_i64(tcg_ctx);
    fd = tcg_temp_new_i64(tcg_ctx);
    fpst = get_fpstatus_ptr(tcg_ctx, 0);

    neon_load_reg64(tcg_ctx, f0, vn);
    neon_load_reg64(tcg_ctx, f1, vm);

    for (;;) {
        if (reads_vd) {
            neon_load_reg64(tcg_ctx, fd, vd);
        }
        fn(tcg_ctx, fd, f0, f1, fpst);
        neon_store_reg64(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }
        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_dreg(vd, delta_d);
        vn = vfp_advance_dreg(vn, delta_d);
        neon_load_reg64(tcg_ctx, f0, vn);
        if (delta_m) {
            vm = vfp_advance_dreg(vm, delta_m);
            neon_load_reg64(tcg_ctx, f1, vm);
        }
    }

    tcg_temp_free_i64(tcg_ctx, f0);
    tcg_temp_free_i64(tcg_ctx, f1);
    tcg_temp_free_i64(tcg_ctx, fd);
    tcg_temp_free_ptr(tcg_ctx, fpst);

    return true;
}